

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_parser_parseIdentifierReferenceReference
          (sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sourcePosition;
  
  sVar1 = sysbvm_parser_lookAt(state,0);
  if (sVar1 != 0) {
    state->tokenPosition = state->tokenPosition + 1;
    sourcePosition = sysbvm_token_getSourcePosition(sVar1);
    sVar1 = sysbvm_token_getValue(sVar1);
    sVar1 = sysbvm_astIdentifierReferenceNode_create(context,sourcePosition,sVar1);
    return sVar1;
  }
  sVar1 = sysbvm_parser_makeSourcePositionForParserState(context,state);
  sVar1 = sysbvm_astErrorNode_createWithCString(context,sVar1,"Expected an identifier.");
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseIdentifierReferenceReference(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    sysbvm_tuple_t token = sysbvm_parser_lookAt(state, 0);
    if(token == SYSBVM_NULL_TUPLE)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected an identifier.");

    ++state->tokenPosition;
    return sysbvm_astIdentifierReferenceNode_create(context, sysbvm_token_getSourcePosition(token), sysbvm_token_getValue(token));
}